

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O0

REF_STATUS ref_phys_usm3d_bc_tag(REF_INT generic,REF_INT *usm3d)

{
  REF_INT *usm3d_local;
  REF_INT generic_local;
  
  *usm3d = generic;
  if (generic == 0x1a06) {
    *usm3d = 1;
  }
  if (generic == 0x13a2) {
    *usm3d = 2;
  }
  if (generic == 5000) {
    *usm3d = 3;
  }
  if (generic == 4000) {
    *usm3d = 4;
  }
  if (generic == 3000) {
    *usm3d = 5;
  }
  if (generic == 0x13bb) {
    *usm3d = 0x65;
  }
  if (generic == 0x13bc) {
    *usm3d = 0x65;
  }
  if (generic == 0x1b63) {
    *usm3d = 0x66;
  }
  if (generic == 0x1b7c) {
    *usm3d = 0x67;
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_phys_usm3d_bc_tag(REF_INT generic, REF_INT *usm3d) {
  *usm3d = generic;

  if (6662 == generic) *usm3d = 1; /* y symmetry */
  if (5026 == generic) *usm3d = 2; /* extrapolate */
  if (5000 == generic) *usm3d = 3; /* farfield riem */
  if (4000 == generic) *usm3d = 4; /* viscous solid */
  if (3000 == generic) *usm3d = 5; /* tangency */

  if (5051 == generic) *usm3d = 101; /* back pressure */
  if (5052 == generic) *usm3d = 101; /* mach outflow */
  if (7011 == generic) *usm3d = 102; /* total pressure */
  if (7036 == generic) *usm3d = 103; /* total pressure */

  return REF_SUCCESS;
}